

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::IntegerStateQueryVerifiers::GetBooleanVerifier::verifyInteger4Mask
          (GetBooleanVerifier *this,TestContext *testCtx,GLenum name,GLint reference0,
          bool enableRef0,GLint reference1,bool enableRef1,GLint reference2,bool enableRef2,
          GLint reference3,bool enableRef3)

{
  ostringstream *this_00;
  char *pcVar1;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  StateQueryMemoryWriteGuard<unsigned_char[4]> local_1c0;
  GLint local_1b4;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_1c0.m_preguard[0] = 0xde;
  local_1c0.m_preguard[1] = 0xde;
  local_1c0.m_preguard[2] = 0xde;
  local_1c0.m_preguard[3] = 0xde;
  local_1c0.m_value[0] = 0xde;
  local_1c0.m_value[1] = 0xde;
  local_1c0.m_value[2] = 0xde;
  local_1c0.m_value[3] = 0xde;
  local_1c0.m_postguard[0] = 0xde;
  local_1c0.m_postguard[1] = 0xde;
  local_1c0.m_postguard[2] = 0xde;
  local_1c0.m_postguard[3] = 0xde;
  glu::CallLogWrapper::glGetBooleanv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,local_1c0.m_value);
  bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char[4]>::verifyValidity
                    (&local_1c0,testCtx);
  if ((bVar2) &&
     (((((enableRef0 && ((bool)local_1c0.m_value[0] != (reference0 != 0))) ||
        ((enableRef1 && ((bool)local_1c0.m_value[1] != (reference1 != 0))))) ||
       ((enableRef2 && ((bool)local_1c0.m_value[2] != (reference2 != 0))))) ||
      ((enableRef3 && ((bool)local_1c0.m_value[3] != (reference3 != 0))))))) {
    local_1b0._0_8_ = testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    local_1b4 = reference1;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"// ERROR: expected ",0x13);
    pcVar1 = "mapped_ == GL_FALSE";
    pcVar4 = "mapped_ == GL_FALSE";
    if (reference0 != 0) {
      pcVar4 = "mapped_ == GL_TRUE";
    }
    pcVar4 = pcVar4 + 0xb;
    if (!enableRef0) {
      pcVar4 = " - ";
    }
    sVar3 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar4,sVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    pcVar4 = "mapped_ == GL_FALSE";
    if (local_1b4 != 0) {
      pcVar4 = "mapped_ == GL_TRUE";
    }
    pcVar4 = pcVar4 + 0xb;
    if (!enableRef1) {
      pcVar4 = " - ";
    }
    sVar3 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar4,sVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    pcVar4 = "mapped_ == GL_FALSE";
    if (reference2 != 0) {
      pcVar4 = "mapped_ == GL_TRUE";
    }
    pcVar4 = pcVar4 + 0xb;
    if (!enableRef2) {
      pcVar4 = " - ";
    }
    sVar3 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar4,sVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    if (reference3 != 0) {
      pcVar1 = "mapped_ == GL_TRUE";
    }
    pcVar4 = " - ";
    if (enableRef3) {
      pcVar4 = pcVar1 + 0xb;
    }
    sVar3 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar4,sVar3);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid boolean value");
    }
  }
  return;
}

Assistant:

void GetBooleanVerifier::verifyInteger4Mask (tcu::TestContext& testCtx, GLenum name, GLint reference0, bool enableRef0, GLint reference1, bool enableRef1, GLint reference2, bool enableRef2, GLint reference3, bool enableRef3)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLboolean[4]> boolVector4;
	glGetBooleanv(name, boolVector4);

	if (!boolVector4.verifyValidity(testCtx))
		return;

	const GLboolean referenceAsGLBoolean[] =
	{
		reference0 ? (GLboolean)GL_TRUE : (GLboolean)GL_FALSE,
		reference1 ? (GLboolean)GL_TRUE : (GLboolean)GL_FALSE,
		reference2 ? (GLboolean)GL_TRUE : (GLboolean)GL_FALSE,
		reference3 ? (GLboolean)GL_TRUE : (GLboolean)GL_FALSE,
	};

	if ((enableRef0 && (boolVector4[0] != referenceAsGLBoolean[0])) ||
		(enableRef1 && (boolVector4[1] != referenceAsGLBoolean[1])) ||
		(enableRef2 && (boolVector4[2] != referenceAsGLBoolean[2])) ||
		(enableRef3 && (boolVector4[3] != referenceAsGLBoolean[3])))
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected "
			<< (enableRef0 ? (referenceAsGLBoolean[0] ? "GL_TRUE" : "GL_FALSE") : " - ") << ", "
			<< (enableRef1 ? (referenceAsGLBoolean[1] ? "GL_TRUE" : "GL_FALSE") : " - ") << ", "
			<< (enableRef2 ? (referenceAsGLBoolean[2] ? "GL_TRUE" : "GL_FALSE") : " - ") << ", "
			<< (enableRef3 ? (referenceAsGLBoolean[3] ? "GL_TRUE" : "GL_FALSE") : " - ") << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid boolean value");
	}
}